

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::deepCopy
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
          *sr)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *this_00;
  HitCounter *this_01;
  reference ppHVar3;
  __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_28;
  __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_20;
  const_iterator it;
  AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  *sr_local;
  RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this_local;
  
  it._M_current = (HitCounter **)sr;
  iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])();
  local_20._M_current =
       (HitCounter **)
       std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::begin
                 ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
                  CONCAT44(extraout_var,iVar2));
  while( true ) {
    this_00 = (vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
              (*(code *)(*it._M_current)[3]._vptr_HitCounter)();
    local_28._M_current =
         (HitCounter **)
         std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_01 = (HitCounter *)operator_new(0x20);
    ppHVar3 = __gnu_cxx::
              __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ::operator*(&local_20);
    HitCounter::HitCounter(this_01,*ppHVar3);
    (*(this->
      super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[0x10])(this,this_01);
    __gnu_cxx::
    __normal_iterator<el::base::HitCounter_*const_*,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }